

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestIterationEnd
          (PrettyUnitTestResultPrinter *this,UnitTest *unit_test,int param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppTVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  uint uVar5;
  pointer ppTVar6;
  undefined4 in_register_00000014;
  char *pcVar7;
  uint uVar8;
  char *in_R8;
  string local_68;
  string local_48;
  
  uVar8 = 0;
  ColoredPrintf(COLOR_GREEN,"[==========] ",CONCAT44(in_register_00000014,param_2));
  uVar5 = UnitTestImpl::test_to_run_count(unit_test->impl_);
  FormatCountableNoun_abi_cxx11_(&local_68,(testing *)(ulong)uVar5,0x1290e9,"tests",in_R8);
  _Var3._M_p = local_68._M_dataplus._M_p;
  ppTVar6 = (unit_test->impl_->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar2 = (unit_test->impl_->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar6 != ppTVar2) {
    uVar8 = 0;
    do {
      uVar8 = uVar8 + (*ppTVar6)->should_run_;
      ppTVar6 = ppTVar6 + 1;
    } while (ppTVar6 != ppTVar2);
  }
  FormatCountableNoun_abi_cxx11_(&local_48,(testing *)(ulong)uVar8,0x12975e,"test cases",in_R8);
  printf("%s from %s ran.",_Var3._M_p,local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  paVar1 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (FLAGS_gtest_print_time == '\x01') {
    local_48._M_dataplus._M_p = (pointer)unit_test->impl_->elapsed_time_;
    StreamableToString<long_long>(&local_68,(longlong *)&local_48);
    printf(" (%s ms total)",local_68._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  putchar(10);
  ColoredPrintf(COLOR_GREEN,"[  PASSED  ] ");
  uVar5 = UnitTestImpl::successful_test_count(unit_test->impl_);
  FormatCountableNoun_abi_cxx11_(&local_68,(testing *)(ulong)uVar5,0x1290e9,"tests",in_R8);
  printf("%s.\n",local_68._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  uVar5 = UnitTestImpl::failed_test_count(unit_test->impl_);
  bVar4 = UnitTestImpl::Passed(unit_test->impl_);
  if (!bVar4) {
    uVar8 = UnitTestImpl::failed_test_count(unit_test->impl_);
    ColoredPrintf(COLOR_RED,"[  FAILED  ] ");
    FormatCountableNoun_abi_cxx11_(&local_68,(testing *)(ulong)uVar8,0x1290e9,"tests",in_R8);
    printf("%s, listed below:\n",local_68._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    PrintFailedTests(unit_test);
    pcVar7 = "TESTS";
    if (uVar5 == 1) {
      pcVar7 = "TEST";
    }
    printf("\n%2d FAILED %s\n",(ulong)uVar5,pcVar7);
  }
  uVar8 = UnitTestImpl::reportable_disabled_test_count(unit_test->impl_);
  if ((uVar8 != 0) && (FLAGS_gtest_also_run_disabled_tests == '\0')) {
    if (uVar5 == 0) {
      putchar(10);
    }
    pcVar7 = "TESTS";
    if (uVar8 == 1) {
      pcVar7 = "TEST";
    }
    ColoredPrintf(COLOR_YELLOW,"  YOU HAVE %d DISABLED %s\n\n",(ulong)uVar8,pcVar7);
  }
  fflush(_stdout);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                     int /*iteration*/) {
  ColoredPrintf(COLOR_GREEN,  "[==========] ");
  printf("%s from %s ran.",
         FormatTestCount(unit_test.test_to_run_count()).c_str(),
         FormatTestCaseCount(unit_test.test_case_to_run_count()).c_str());
  if (GTEST_FLAG(print_time)) {
    printf(" (%s ms total)",
           internal::StreamableToString(unit_test.elapsed_time()).c_str());
  }
  printf("\n");
  ColoredPrintf(COLOR_GREEN,  "[  PASSED  ] ");
  printf("%s.\n", FormatTestCount(unit_test.successful_test_count()).c_str());

  int num_failures = unit_test.failed_test_count();
  if (!unit_test.Passed()) {
    const int failed_test_count = unit_test.failed_test_count();
    ColoredPrintf(COLOR_RED,  "[  FAILED  ] ");
    printf("%s, listed below:\n", FormatTestCount(failed_test_count).c_str());
    PrintFailedTests(unit_test);
    printf("\n%2d FAILED %s\n", num_failures,
                        num_failures == 1 ? "TEST" : "TESTS");
  }

  int num_disabled = unit_test.reportable_disabled_test_count();
  if (num_disabled && !GTEST_FLAG(also_run_disabled_tests)) {
    if (!num_failures) {
      printf("\n");  // Add a spacer if no FAILURE banner is displayed.
    }
    ColoredPrintf(COLOR_YELLOW,
                  "  YOU HAVE %d DISABLED %s\n\n",
                  num_disabled,
                  num_disabled == 1 ? "TEST" : "TESTS");
  }
  // Ensure that Google Test output is printed before, e.g., heapchecker output.
  fflush(stdout);
}